

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O3

void renderViewer(double cpuDt,double gpuDt)

{
  bool bVar1;
  ImDrawData *draw_data;
  char *brdfModes [2];
  char *aaItems [5];
  ImVec2 local_458;
  char *pcStack_450;
  ImVec2 local_418;
  char *pcStack_410;
  char *local_408;
  char *pcStack_400;
  char *local_3f8;
  
  (*glad_glBindFramebuffer)(0x8ca9,g_gl.framebuffers[0]);
  (*glad_glBindFramebuffer)(0x8ca8,g_gl.framebuffers[1]);
  (*glad_glViewport)(0,0,g_app.viewer.w,g_app.viewer.h);
  (*glad_glClearColor)(0.0,0.0,0.0,0.0);
  (*glad_glClear)(0x4000);
  (*glad_glUseProgram)(g_gl.programs[0]);
  (*glad_glBindVertexArray)(g_gl.vertexArrays[0]);
  (*glad_glDrawArrays)(5,0,4);
  if (g_app.viewer.hud == true) {
    (*glad_glUseProgram)(0);
    ImGui_ImplGlfwGL3_NewFrame();
    local_418.x = 270.0;
    local_418.y = 10.0;
    local_458.x = 0.0;
    local_458.y = 0.0;
    ImGui::SetNextWindowPos(&local_418,0,&local_458);
    local_418.x = 250.0;
    local_418.y = 120.0;
    ImGui::SetNextWindowSize(&local_418,0);
    ImGui::Begin("Framebuffer",(bool *)0x0,0);
    local_3f8 = "MSAA x16";
    local_408 = "MSAA x4";
    pcStack_400 = "MSAA x8";
    local_418 = (ImVec2)((long)"g.NavMoveRequestForward == ImGuiNavForward_None" + 0x2b);
    pcStack_410 = "MSAA x2";
    bVar1 = ImGui::Combo("AA",&g_framebuffer.aa,(char **)&local_418,5,-1);
    if (bVar1) {
      imguiSetAa();
    }
    bVar1 = ImGui::Combo("MSAA",&g_framebuffer.msaa.fixed,"Fixed",-1);
    if (bVar1) {
      imguiSetAa();
    }
    ImGui::Checkbox("Progressive",&g_framebuffer.flags.progressive);
    if (g_framebuffer.flags.progressive == true) {
      ImGui::SameLine(0.0,-1.0);
      local_458.x = 0.0;
      local_458.y = 0.0;
      bVar1 = ImGui::Button("Reset",&local_458);
      if (bVar1) {
        g_framebuffer.flags.reset = true;
      }
    }
    ImGui::End();
    local_418.x = 530.0;
    local_418.y = 10.0;
    local_458.x = 0.0;
    local_458.y = 0.0;
    ImGui::SetNextWindowPos(&local_418,0,&local_458);
    local_418.x = 250.0;
    local_418.y = 120.0;
    ImGui::SetNextWindowSize(&local_418,0);
    ImGui::Begin("Viewer",(bool *)0x0,0);
    bVar1 = ImGui::SliderFloat("Exposure",&g_app.viewer.exposure,-3.0,3.0,"%.3f",1.0);
    if (bVar1) {
      configureSphereProgram();
      configureParametricProgram();
      g_framebuffer.flags.reset = true;
    }
    local_418.x = 0.0;
    local_418.y = 0.0;
    bVar1 = ImGui::Button("Take Screenshot",&local_418);
    if (bVar1) {
      snprintf((char *)&local_418,0x400,"screenshot%03i",(ulong)(uint)renderViewer::cnt);
      (*glad_glBindFramebuffer)(0x8ca8,0);
      djgt_save_glcolorbuffer_png(0x404,0x1908,(char *)&local_418);
      renderViewer::cnt = renderViewer::cnt + 1;
    }
    local_418.x = 0.0;
    local_418.y = 0.0;
    bVar1 = ImGui::Button("Record",&local_418);
    if (bVar1) {
      g_app.recorder.on = (int)(g_app.recorder.on == 0);
    }
    if (g_app.recorder.on != 0) {
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("Recording...");
    }
    ImGui::End();
    local_418.x = 10.0;
    local_418.y = 10.0;
    local_458.x = 0.0;
    local_458.y = 0.0;
    ImGui::SetNextWindowPos(&local_418,0,&local_458);
    local_418.x = 250.0;
    local_418.y = 120.0;
    ImGui::SetNextWindowSize(&local_418,0);
    ImGui::Begin("Camera",(bool *)0x0,0);
    bVar1 = ImGui::SliderFloat("FOVY",&g_camera.fovy,1.0,179.0,"%.3f",1.0);
    if (bVar1) {
      g_framebuffer.flags.reset = true;
    }
    bVar1 = ImGui::SliderFloat("zNear",&g_camera.zNear,0.01,100.0,"%.3f",1.0);
    if ((bVar1) && (g_camera.zFar <= g_camera.zNear)) {
      g_camera.zNear = g_camera.zFar + -0.01;
    }
    bVar1 = ImGui::SliderFloat("zFar",&g_camera.zFar,1.0,1500.0,"%.3f",1.0);
    if ((bVar1) && (g_camera.zFar <= g_camera.zNear)) {
      g_camera.zFar = g_camera.zNear + 0.01;
    }
    ImGui::End();
    local_418.x = 10.0;
    local_418.y = 140.0;
    local_458.x = 0.0;
    local_458.y = 0.0;
    ImGui::SetNextWindowPos(&local_418,0,&local_458);
    local_418.x = 250.0;
    local_418.y = 450.0;
    ImGui::SetNextWindowSize(&local_418,0);
    ImGui::Begin("Sphere",(bool *)0x0,0);
    local_408 = "BRDF";
    pcStack_400 = "Debug";
    local_418 = (ImVec2)((long)"u_Color" + 2);
    pcStack_410 = "Colormap";
    bVar1 = ImGui::Combo("Shading",&g_sphere.shading.mode,(char **)&local_418,4,-1);
    if (bVar1) {
      loadSphereProgram();
      loadParametricProgram();
      loadViewerProgram();
      g_framebuffer.flags.reset = true;
    }
    if (g_sphere.shading.merl.files.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        g_sphere.shading.merl.files.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = ImGui::Combo("Merl",&g_sphere.shading.merl.id,
                           g_sphere.shading.merl.files.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (int)((ulong)((long)g_sphere.shading.merl.files.
                                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)g_sphere.shading.merl.files.
                                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3),-1);
      if (bVar1) {
        loadMerlTexture();
        loadSphereProgram();
        loadParametricProgram();
        g_framebuffer.flags.reset = true;
      }
    }
    bVar1 = ImGui::CollapsingHeader("Flags",0x20);
    if (bVar1) {
      bVar1 = ImGui::Checkbox("Surface",(bool *)&g_sphere);
      if (bVar1) {
        g_framebuffer.flags.reset = true;
      }
      bVar1 = ImGui::Checkbox("Wireframe",&g_sphere.flags.showLines);
      if (bVar1) {
        g_framebuffer.flags.reset = true;
      }
      bVar1 = ImGui::Checkbox("HelperWiDir",&g_sphere.flags.showWiHelper);
      if (bVar1) {
        g_framebuffer.flags.reset = true;
      }
      bVar1 = ImGui::Checkbox("Samples",&g_sphere.flags.showSamples);
      if (bVar1) {
        g_framebuffer.flags.reset = true;
      }
      bVar1 = ImGui::Checkbox("Parametric",&g_sphere.flags.showParametric);
      if (bVar1) {
        g_framebuffer.flags.reset = true;
      }
    }
    bVar1 = ImGui::CollapsingHeader("Geometry",0x20);
    if (bVar1) {
      bVar1 = ImGui::SliderInt("xTess",&g_sphere.sphere.xTess,0,0x80,"%d");
      if (bVar1) {
        loadSphereMeshBuffers();
        loadSphereVertexArray();
        g_framebuffer.flags.reset = true;
      }
      bVar1 = ImGui::SliderInt("yTess",&g_sphere.sphere.yTess,0,0x80,"%d");
      if (bVar1) {
        loadSphereMeshBuffers();
        loadSphereVertexArray();
        g_framebuffer.flags.reset = true;
      }
      bVar1 = ImGui::ColorEdit4("Color",&g_sphere.sphere.color.r,0);
      if (bVar1) {
        g_framebuffer.flags.reset = true;
        configureSphereProgram();
        configureParametricProgram();
      }
    }
    bVar1 = ImGui::CollapsingHeader("BRDF Settings",0x20);
    if (bVar1) {
      if (g_sphere.shading.merl.files.
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          g_sphere.shading.merl.files.
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_458 = (ImVec2)0x1b6cf8;
        pcStack_450 = "Merl";
        bVar1 = ImGui::Combo("BRDF",&g_sphere.brdf.id,(char **)&local_458,2,-1);
        if (bVar1) {
          loadSphereProgram();
          loadParametricProgram();
          g_framebuffer.flags.reset = true;
        }
      }
      bVar1 = ImGui::SliderFloat("Alpha",&g_sphere.brdf.ggxAlpha,0.0,1.0,"%.3f",1.0);
      if (bVar1) {
        configurePrograms();
        g_framebuffer.flags.reset = true;
      }
      bVar1 = ImGui::SliderFloat("thetaI",&g_sphere.brdf.thetaI,0.0,89.0,"%.3f",1.0);
      if (bVar1) {
        configurePrograms();
        g_framebuffer.flags.reset = true;
      }
      bVar1 = ImGui::SliderFloat("PhiI",&g_sphere.brdf.phiI,0.0,360.0,"%.3f",1.0);
      if (bVar1) {
        configurePrograms();
        g_framebuffer.flags.reset = true;
      }
    }
    bVar1 = ImGui::CollapsingHeader("Sample Settings",0x20);
    if (bVar1) {
      local_458 = (ImVec2)0x1b6ca1;
      pcStack_450 = "GGX";
      bVar1 = ImGui::Combo("Scheme",&g_sphere.samples.scheme,(char **)&local_458,2,-1);
      if (bVar1) {
        loadSamplesProgram();
        loadParametricProgram();
        g_framebuffer.flags.reset = true;
      }
    }
    ImGui::End();
    ImGui::Render();
    draw_data = ImGui::GetDrawData();
    ImGui_ImplGlfwGL3_RenderDrawData(draw_data);
  }
  if (g_app.recorder.on != 0) {
    (*glad_glBindFramebuffer)(0x8ca8,g_gl.framebuffers[0]);
    sprintf((char *)&local_458,"capture_%02i_%09i",(ulong)(uint)g_app.recorder.capture,
            (ulong)(uint)g_app.recorder.frame);
    strcpy((char *)&local_418,g_app.dir.output);
    strcat((char *)&local_418,(char *)&local_458);
    djgt_save_glcolorbuffer_bmp(0x8ce0,0x1907,(char *)&local_418);
    g_app.recorder.frame = g_app.recorder.frame + 1;
  }
  (*glad_glBindFramebuffer)(0x8ca9,0);
  (*glad_glBindFramebuffer)(0x8ca8,0);
  return;
}

Assistant:

void renderViewer(double cpuDt, double gpuDt)
{
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_BACK]);
    glBindFramebuffer(GL_READ_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_SCENE]);
    glViewport(0, 0, g_app.viewer.w, g_app.viewer.h);
    glClearColor(0, 0, 0, 0);
    glClear(GL_COLOR_BUFFER_BIT);

    // post process the scene framebuffer
    glUseProgram(g_gl.programs[PROGRAM_VIEWER]);
    glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

    // draw HUD
    if (g_app.viewer.hud) {
        // ImGui
        glUseProgram(0);
        ImGui_ImplGlfwGL3_NewFrame();
        // Viewer Widgets
        ImGui::SetNextWindowPos(ImVec2(270, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Framebuffer");
        {
            const char* aaItems[] = {
                "None",
                "MSAA x2",
                "MSAA x4",
                "MSAA x8",
                "MSAA x16"
            };
            if (ImGui::Combo("AA", &g_framebuffer.aa, aaItems, BUFFER_SIZE(aaItems)))
                imguiSetAa();
            if (ImGui::Combo("MSAA", &g_framebuffer.msaa.fixed, "Fixed\0Random\0\0"))
                imguiSetAa();
            ImGui::Checkbox("Progressive", &g_framebuffer.flags.progressive);
            if (g_framebuffer.flags.progressive) {
                ImGui::SameLine();
                if (ImGui::Button("Reset"))
                    g_framebuffer.flags.reset = true;
            }
        }
        ImGui::End();
        // Framebuffer Widgets
        ImGui::SetNextWindowPos(ImVec2(530, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Viewer");
        {
            if (ImGui::SliderFloat("Exposure", &g_app.viewer.exposure, -3.0f, 3.0f)) {
                configureSphereProgram();
                configureParametricProgram();
                g_framebuffer.flags.reset = true;
            }
            if (ImGui::Button("Take Screenshot")) {
                static int cnt = 0;
                char buf[1024];

                snprintf(buf, 1024, "screenshot%03i", cnt);
                glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
                djgt_save_glcolorbuffer_png(GL_FRONT, GL_RGBA, buf);
                ++cnt;
            }
            if (ImGui::Button("Record"))
                g_app.recorder.on = !g_app.recorder.on;
            if (g_app.recorder.on) {
                ImGui::SameLine();
                ImGui::Text("Recording...");
            }
        }
        ImGui::End();
        // Camera Widgets
        ImGui::SetNextWindowPos(ImVec2(10, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Camera");
        {
            if (ImGui::SliderFloat("FOVY", &g_camera.fovy, 1.0f, 179.0f))
                g_framebuffer.flags.reset = true;
            if (ImGui::SliderFloat("zNear", &g_camera.zNear, 0.01f, 100.f)) {
                if (g_camera.zNear >= g_camera.zFar)
                    g_camera.zNear = g_camera.zFar - 0.01f;
            }
            if (ImGui::SliderFloat("zFar", &g_camera.zFar, 1.f, 1500.f)) {
                if (g_camera.zFar <= g_camera.zNear)
                    g_camera.zFar = g_camera.zNear + 0.01f;
            }
        }
        ImGui::End();
        // Lighting/Planets Widgets
        ImGui::SetNextWindowPos(ImVec2(10, 140)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 450)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Sphere");
        {
            const char* shadingModes[] = {
                "Color",
                "Colormap",
                "BRDF",
                "Debug"
            };
            if (ImGui::Combo("Shading", &g_sphere.shading.mode, shadingModes, BUFFER_SIZE(shadingModes))) {
                loadSphereProgram();
                loadParametricProgram();
                loadViewerProgram();
                g_framebuffer.flags.reset = true;
            }
            if (!g_sphere.shading.merl.files.empty() > 0) {
                if (ImGui::Combo("Merl", &g_sphere.shading.merl.id, &g_sphere.shading.merl.files[0], g_sphere.shading.merl.files.size())) {
                    loadMerlTexture();
                    loadSphereProgram();
                    loadParametricProgram();
                    g_framebuffer.flags.reset = true;
                }
            }
            if (ImGui::CollapsingHeader("Flags", ImGuiTreeNodeFlags_DefaultOpen)) {
                if (ImGui::Checkbox("Surface", &g_sphere.flags.showSurface))
                    g_framebuffer.flags.reset = true;
                if (ImGui::Checkbox("Wireframe", &g_sphere.flags.showLines))
                    g_framebuffer.flags.reset = true;
                if (ImGui::Checkbox("HelperWiDir", &g_sphere.flags.showWiHelper))
                    g_framebuffer.flags.reset = true;
                if (ImGui::Checkbox("Samples", &g_sphere.flags.showSamples))
                    g_framebuffer.flags.reset = true;
                if (ImGui::Checkbox("Parametric", &g_sphere.flags.showParametric))
                    g_framebuffer.flags.reset = true;
            }
            if (ImGui::CollapsingHeader("Geometry", ImGuiTreeNodeFlags_DefaultOpen)) {
                if (ImGui::SliderInt("xTess", &g_sphere.sphere.xTess, 0, 128)) {
                    loadSphereMeshBuffers();
                    loadSphereVertexArray();
                    g_framebuffer.flags.reset = true;
                }
                if (ImGui::SliderInt("yTess", &g_sphere.sphere.yTess, 0, 128)) {
                    loadSphereMeshBuffers();
                    loadSphereVertexArray();
                    g_framebuffer.flags.reset = true;
                }
                if (ImGui::ColorEdit4("Color", &g_sphere.sphere.color.r)) {
                    g_framebuffer.flags.reset = true;
                    configureSphereProgram();
                    configureParametricProgram();
                }
            }
            if (ImGui::CollapsingHeader("BRDF Settings", ImGuiTreeNodeFlags_DefaultOpen)) {
                if (!g_sphere.shading.merl.files.empty()) {
                    const char* brdfModes[] = {
                        "GGX",
                        "Merl"
                    };
                    if (ImGui::Combo("BRDF", &g_sphere.brdf.id, brdfModes, BUFFER_SIZE(brdfModes))) {
                        loadSphereProgram();
                        loadParametricProgram();
                        g_framebuffer.flags.reset = true;
                    }
                }
                if  (ImGui::SliderFloat("Alpha", &g_sphere.brdf.ggxAlpha, 0.0f, 1.f)) {
                    configurePrograms();
                    g_framebuffer.flags.reset = true;
                }
                if (ImGui::SliderFloat("thetaI", &g_sphere.brdf.thetaI, 0.0f, 89.f)) {
                    configurePrograms();
                    g_framebuffer.flags.reset = true;
                }
                if (ImGui::SliderFloat("PhiI", &g_sphere.brdf.phiI, 0.0f, 360.f)) {
                    configurePrograms();
                    g_framebuffer.flags.reset = true;
                }
            }
            if (ImGui::CollapsingHeader("Sample Settings", ImGuiTreeNodeFlags_DefaultOpen)) {
                const char* samplingSchemes[] = {
                    "Merl",
                    "GGX"
                };
                if (ImGui::Combo("Scheme", &g_sphere.samples.scheme, samplingSchemes, BUFFER_SIZE(samplingSchemes))) {
                    loadSamplesProgram();
                    loadParametricProgram();
                    g_framebuffer.flags.reset = true;
                }
            }
        }
        ImGui::End();

        ImGui::Render();
        ImGui_ImplGlfwGL3_RenderDrawData(ImGui::GetDrawData());
    }

    // screen recording
    if (g_app.recorder.on) {
        char name[64], path[1024];

        glBindFramebuffer(GL_READ_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_BACK]);
        sprintf(name, "capture_%02i_%09i",
                g_app.recorder.capture,
                g_app.recorder.frame);
        strcat2(path, g_app.dir.output, name);
        djgt_save_glcolorbuffer_bmp(GL_COLOR_ATTACHMENT0, GL_RGB, path);
        ++g_app.recorder.frame;
    }

    // restore state
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
    glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
}